

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaScript.c
# Opt level: O0

void Gia_ManAigPrintPiLevels(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(p);
    bVar3 = false;
    if (local_1c < iVar1) {
      pGStack_18 = Gia_ManCi(p,local_1c);
      bVar3 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    uVar2 = Gia_ObjLevel(p,pGStack_18);
    printf("%d ",(ulong)uVar2);
    local_1c = local_1c + 1;
  }
  printf("\n");
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Synthesis script.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_ManAigPrintPiLevels( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachPi( p, pObj, i )
        printf( "%d ", Gia_ObjLevel(p, pObj) );
    printf( "\n" );
}